

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rep.cpp
# Opt level: O0

int __thiscall zmq::rep_t::xsend(rep_t *this,msg_t *msg_)

{
  byte bVar1;
  int *piVar2;
  msg_t *in_RSI;
  long in_RDI;
  int rc;
  bool more;
  msg_t *in_stack_00000090;
  router_t *in_stack_00000098;
  undefined4 local_4;
  
  if ((*(byte *)(in_RDI + 0x84c) & 1) == 0) {
    piVar2 = __errno_location();
    *piVar2 = 0x9523dfb;
    local_4 = -1;
  }
  else {
    bVar1 = msg_t::flags(in_RSI);
    local_4 = router_t::xsend(in_stack_00000098,in_stack_00000090);
    if (local_4 == 0) {
      if ((bVar1 & 1) == 0) {
        *(undefined1 *)(in_RDI + 0x84c) = 0;
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int zmq::rep_t::xsend (msg_t *msg_)
{
    //  If we are in the middle of receiving a request, we cannot send reply.
    if (!_sending_reply) {
        errno = EFSM;
        return -1;
    }

    const bool more = (msg_->flags () & msg_t::more) != 0;

    //  Push message to the reply pipe.
    const int rc = router_t::xsend (msg_);
    if (rc != 0)
        return rc;

    //  If the reply is complete flip the FSM back to request receiving state.
    if (!more)
        _sending_reply = false;

    return 0;
}